

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase63::run(TestCase63 *this)

{
  int iVar1;
  char *pcVar2;
  undefined8 __s1;
  Maybe<kj::Exception> e;
  AddFailureAdapter local_198;
  Maybe<kj::Exception> local_180;
  
  local_198._0_8_ = &PTR_run_001c11d0;
  runCatchingExceptions(&local_180,(Runnable *)&local_198);
  if (local_180.ptr.isSet == true) {
    __s1 = local_180.ptr.field_1.value.description.content.ptr;
    if (local_180.ptr.field_1.value.description.content.size_ == 0) {
      __s1 = (undefined **)0x1a0571;
    }
    pcVar2 = (char *)(local_180.ptr.field_1.value.description.content.size_ +
                     (local_180.ptr.field_1.value.description.content.size_ == 0));
    if (((local_180.ptr.field_1.value.description.content.size_ != 0x14) ||
        (iVar1 = bcmp((void *)__s1,"std::exception: foo",(size_t)(pcVar2 + -1)), iVar1 != 0)) &&
       (Debug::minSeverity < 3)) {
      local_198._0_8_ = __s1;
      local_198.file = pcVar2;
      Debug::log<char_const(&)[67],char_const(&)[20],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x45,ERROR,
                 "\"failed: expected \" \"(\\\"std::exception: foo\\\") == (ex->getDescription())\", \"std::exception: foo\", ex->getDescription()"
                 ,(char (*) [67])
                  "failed: expected (\"std::exception: foo\") == (ex->getDescription())",
                 (char (*) [20])"std::exception: foo",(StringPtr *)&local_198);
    }
  }
  else {
    local_198.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
    ;
    local_198.line = 0x47;
    local_198.handled = true;
    Debug::log<char_const(&)[19],char_const(&)[19]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x47,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [19])"Expected exception");
    AddFailureAdapter::~AddFailureAdapter(&local_198);
  }
  if (local_180.ptr.isSet == true) {
    Exception::~Exception(&local_180.ptr.field_1.value);
  }
  return;
}

Assistant:

TEST(String, Nullptr) {
  EXPECT_EQ(String(nullptr), "");
  EXPECT_EQ(StringPtr(String(nullptr)).size(), 0u);
  EXPECT_EQ(StringPtr(String(nullptr))[0], '\0');
}